

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.h
# Opt level: O3

void __thiscall
Jinx::Impl::Script::ExecutionFrame::ExecutionFrame(ExecutionFrame *this,BufferPtr *b,char *n)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  
  peVar1 = (b->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->bytecode).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  this_00 = (b->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->bytecode).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this_00;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001ed67e:
    (this->reader).m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (this->reader).m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->reader).m_pos = 0;
    goto LAB_001ed6ac;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    peVar1 = (b->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (b->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001ed67e;
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00)->_M_use_count + 1;
    UNLOCK();
    bVar2 = __libc_single_threaded != '\0';
    (this->reader).m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (this->reader).m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = this_00;
    if (bVar2) goto LAB_001ed69c;
    LOCK();
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00)->_M_use_count + 1;
    (this->reader).m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (this->reader).m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = this_00;
LAB_001ed69c:
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00)->_M_use_count + 1;
  }
  (this->reader).m_pos = 0;
  Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
LAB_001ed6ac:
  this->name = n;
  this->stackTop = 0;
  this->onReturn = Continue;
  return;
}

Assistant:

ExecutionFrame(BufferPtr b, const char * n) : bytecode(b), reader(b), name(n) {}